

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

double __thiscall
despot::RockSampleApproxParticleUpperBound::Value
          (RockSampleApproxParticleUpperBound *this,State *state)

{
  BaseRockSample *pBVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  int rock;
  size_type __n;
  double dVar5;
  reference rVar6;
  ulong local_80;
  Coord rock_pos;
  double local_70;
  double local_68;
  vector<bool,_std::allocator<bool>_> visited;
  
  uVar4 = BaseRockSample::GetRobPos(this->rs_model_,state);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&visited,(long)this->rs_model_->num_rocks_,(allocator_type *)&rock_pos);
  local_68 = 0.0;
  local_70 = 1.0;
  while( true ) {
    iVar3 = this->rs_model_->size_;
    despot::Coord::Coord(&rock_pos,-1,-1);
    iVar3 = iVar3 * 2;
    __n = 0;
    local_80 = 0xffffffff;
    while( true ) {
      pBVar1 = this->rs_model_;
      if ((long)pBVar1->num_rocks_ <= (long)__n) break;
      iVar2 = despot::Coord::ManhattanDistance
                        (uVar4,*(undefined8 *)
                                ((pBVar1->rock_pos_).
                                 super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
                                 _M_impl.super__Vector_impl_data._M_start + __n * 8));
      if (((*(uint *)(state + 0xc) >> ((uint)__n & 0x1f) & 1) != 0) && (iVar2 < iVar3)) {
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,__n);
        if ((*rVar6._M_p & rVar6._M_mask) == 0) {
          _rock_pos = *(undefined8 *)
                       ((this->rs_model_->rock_pos_).
                        super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                        super__Vector_impl_data._M_start + __n * 8);
          local_80 = __n & 0xffffffff;
          iVar3 = iVar2;
        }
      }
      __n = __n + 1;
    }
    if ((int)local_80 == -1) break;
    iVar3 = despot::Coord::ManhattanDistance(_rock_pos,uVar4);
    dVar5 = pow(_ParticleBelief,(double)iVar3);
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[](&visited,(long)(int)local_80);
    local_70 = local_70 * dVar5;
    local_68 = local_68 + local_70 * 10.0;
    *rVar6._M_p = *rVar6._M_p | rVar6._M_mask;
    uVar4 = _rock_pos;
  }
  dVar5 = pow(_ParticleBelief,
              (double)(pBVar1->size_ -
                      (*(int *)(state + 0xc) >> ((byte)pBVar1->num_rocks_ & 0x1f)) %
                      (pBVar1->grid_).xsize_));
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&visited.super__Bvector_base<std::allocator<bool>_>);
  return dVar5 * local_70 * 10.0 + local_68;
}

Assistant:

double Value(const State& state) const {
		double value = 0;
		double discount = 1.0;
		Coord rob_pos = rs_model_->GetRobPos(&state);
		vector<bool> visited(rs_model_->num_rocks_);
		while (true) {
			// Move to the nearest valuable rock and sample
			int shortest = 2 * rs_model_->size_;
			int id = -1;
			Coord rock_pos(-1, -1);
			for (int rock = 0; rock < rs_model_->num_rocks_; rock++) {
				int dist = Coord::ManhattanDistance(rob_pos,
					rs_model_->rock_pos_[rock]);
				if (CheckFlag(state.state_id, rock) && dist < shortest
					&& !visited[rock]) {
					shortest = dist;
					id = rock;
					rock_pos = rs_model_->rock_pos_[rock];
				}
			}

			if (id == -1)
				break;

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * 10.0;
			visited[id] = true;
			rob_pos = rock_pos;
		}

		value += 10.0 * discount
			* Globals::Discount(rs_model_->size_ - rs_model_->GetX(&state));
		return value;
	}